

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O2

_Bool fiber_alloc(Fiber *fbr,size_t size,FiberCleanupFunc cleanup,void *arg,FiberFlags flags)

{
  _Bool _Var1;
  size_t sVar2;
  ulong uVar3;
  void *pvVar4;
  short sVar5;
  long lVar6;
  ushort uVar7;
  
  fbr->stack_size = size;
  uVar7 = flags & 0x18;
  if (uVar7 == 0) {
    pvVar4 = malloc(size);
    fbr->stack = pvVar4;
    fbr->alloc_stack = pvVar4;
    if (pvVar4 == (void *)0x0) {
      return false;
    }
  }
  else {
    sVar2 = get_page_size();
    uVar3 = (sVar2 + size) - 1;
    lVar6 = (ulong)((flags & 8) >> 3) + uVar3 / sVar2;
    pvVar4 = (void *)memalign(sVar2,((lVar6 + 1) - (ulong)(uVar7 < 0x10)) * sVar2,uVar3 % sVar2);
    fbr->alloc_stack = pvVar4;
    if (pvVar4 == (void *)0x0) {
      return false;
    }
    sVar5 = (short)(flags & 8);
    if (((sVar5 != 0) && (_Var1 = protect_page(pvVar4,false), !_Var1)) ||
       ((0xf < uVar7 &&
        (_Var1 = protect_page((void *)(lVar6 * sVar2 + (long)fbr->alloc_stack),false), !_Var1)))) {
      free(fbr->alloc_stack);
      return false;
    }
    if (sVar5 == 0) {
      sVar2 = 0;
    }
    fbr->stack = (void *)(sVar2 + (long)fbr->alloc_stack);
  }
  fbr->state = uVar7;
  fiber_init_(fbr,cleanup,arg);
  return true;
}

Assistant:

bool
fiber_alloc(Fiber *fbr,
            size_t size,
            FiberCleanupFunc cleanup,
            void *arg,
            FiberFlags flags)
{
    NULL_CHECK(fbr, "Fiber cannot be NULL");
    flags &= FIBER_FLAG_GUARD_LO | FIBER_FLAG_GUARD_HI;
    fbr->stack_size = size;
    const size_t stack_size = size;

    if (!flags) {
        fbr->alloc_stack = fbr->stack = malloc(stack_size);
        if (!fbr->alloc_stack)
            return false;
    } else {
        size_t pgsz = get_page_size();
        size_t npages = (size + pgsz - 1) / pgsz;
        if (flags & FIBER_FLAG_GUARD_LO)
            ++npages;
        if (flags & FIBER_FLAG_GUARD_HI)
            ++npages;
        fbr->alloc_stack = alloc_aligned_chunks(npages, pgsz);
        if (hu_unlikely(!fbr->alloc_stack))
            return false;

        if (flags & FIBER_FLAG_GUARD_LO)
            if (hu_unlikely(!protect_page(fbr->alloc_stack, false)))
                goto fail;

        if (flags & FIBER_FLAG_GUARD_HI)
            if (hu_unlikely(!protect_page(
                  (char *) fbr->alloc_stack + (npages - 1) * pgsz, false)))
                goto fail;
        if (flags & FIBER_FLAG_GUARD_LO)
            fbr->stack = (char *) fbr->alloc_stack + pgsz;
        else
            fbr->stack = fbr->alloc_stack;
    }

    fbr->state = flags;
    fiber_init_(fbr, cleanup, arg);
    return true;

fail:
    free_pages(fbr->alloc_stack);
    return false;
}